

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

int * __thiscall
google::protobuf::internal::ExtensionSet::GetRefEnum
          (ExtensionSet *this,int number,int *default_value)

{
  Extension *pEVar1;
  string *psVar2;
  anon_enum_32 local_24;
  anon_enum_32 local_20 [4];
  
  pEVar1 = FindOrNull(this,number);
  if ((pEVar1 != (Extension *)0x0) && ((pEVar1->field_0xa & 2) == 0)) {
    local_20[0] = pEVar1->is_repeated ^ OPTIONAL_FIELD;
    local_24 = OPTIONAL_FIELD;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                       (local_20,&local_24,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
    if (psVar2 == (string *)0x0) {
      local_20[0] = anon_unknown_58::cpp_type(pEVar1->type);
      local_24 = 8;
      psVar2 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (local_20,&local_24,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
      if (psVar2 == (string *)0x0) {
        return (int *)pEVar1;
      }
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x1e2,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20)
    ;
  }
  return default_value;
}

Assistant:

const int& ExtensionSet::GetRefEnum(int number,
                                    const int& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}